

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::StateSaver::StateSaver(StateSaver *this,DFA *dfa,State *state)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  if (in_RDX < (undefined8 *)0x3) {
    in_RDI[1] = 0;
    *(undefined4 *)(in_RDI + 2) = 0;
    *(undefined4 *)((long)in_RDI + 0x14) = 0;
    *(undefined1 *)(in_RDI + 3) = 1;
    in_RDI[4] = in_RDX;
  }
  else {
    *(undefined1 *)(in_RDI + 3) = 0;
    in_RDI[4] = 0;
    *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)((long)in_RDX + 0xc);
    *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RDX + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 2);
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[1] = pvVar3;
    memmove((void *)in_RDI[1],(void *)*in_RDX,(long)*(int *)(in_RDI + 2) << 2);
  }
  return;
}

Assistant:

DFA::StateSaver::StateSaver(DFA* dfa, State* state) {
  dfa_ = dfa;
  if (state <= SpecialStateMax) {
    inst_ = NULL;
    ninst_ = 0;
    flag_ = 0;
    is_special_ = true;
    special_ = state;
    return;
  }
  is_special_ = false;
  special_ = NULL;
  flag_ = state->flag_;
  ninst_ = state->ninst_;
  inst_ = new int[ninst_];
  memmove(inst_, state->inst_, ninst_*sizeof inst_[0]);
}